

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ForkBranch<unsigned_int>::get(ForkBranch<unsigned_int> *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    *(undefined4 *)&output[1].exception.ptr.field_0x4 = *(undefined4 *)&other[1].field_0x4;
    output[1].exception.ptr.isSet = true;
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(*value);
    } else {
      output.as<T>().value = nullptr;
    }